

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statements.h
# Opt level: O2

void __thiscall
ForStatement::GenerateStatementInline(ForStatement *this,ostream *out,int n,StatementPtr *statement)

{
  element_type *peVar1;
  string text;
  ostringstream statementBuffer;
  string local_1b8;
  ostringstream local_198 [376];
  
  std::__cxx11::ostringstream::ostringstream(local_198);
  peVar1 = (statement->super___shared_ptr<Statement,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (*peVar1->_vptr_Statement[1])(peVar1,local_198,0);
  std::__cxx11::stringbuf::str();
  while ((local_1b8._M_string_length != 0 &&
         ((local_1b8._M_dataplus._M_p[local_1b8._M_string_length - 1] == ';' ||
          (local_1b8._M_dataplus._M_p[local_1b8._M_string_length - 1] == '\n'))))) {
    std::__cxx11::string::resize((ulong)&local_1b8);
  }
  AssureIndents(&local_1b8,n);
  std::operator<<(out,(string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::ostringstream::~ostringstream(local_198);
  return;
}

Assistant:

void GenerateStatementInline( std::ostream& out, int n, StatementPtr statement ) const
	{
		std::ostringstream statementBuffer;
		statement->GenerateCode(statementBuffer, 0);

		std::string text = statementBuffer.str();

		while (!text.empty() && (text[text.length()-1] == '\n' || text[text.length()-1] == ';'))
			text.resize(text.length()-1); //remove last element

		AssureIndents(text, n);

		out << text;
	}